

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
nlohmann::json_abi_v3_11_2::detail::
concat<std::__cxx11::string,std::__cxx11::string,char_const(&)[12],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,std::__cxx11::string_const&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,detail *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          char (*args_1) [12],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          char (*args_3) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  concat_length<std::__cxx11::string,char_const(&)[12],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char (*) [12])args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
             (char (*) [3])args_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_3,args_4);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  concat_into<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_(&)[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
            (__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char (*) [12])args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
             (char (*) [3])args_2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_3,args_4);
  return __return_storage_ptr__;
}

Assistant:

inline OutStringType concat(Args && ... args)
{
    OutStringType str;
    str.reserve(concat_length(std::forward<Args>(args)...));
    concat_into(str, std::forward<Args>(args)...);
    return str;
}